

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Token>::emplaceRealloc<slang::parsing::Token_const&>
          (SmallVectorBase<slang::parsing::Token> *this,pointer pos,Token *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  size_type sVar3;
  undefined8 *puVar4;
  Info *pIVar5;
  undefined8 uVar6;
  pointer pTVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  pointer pTVar11;
  pointer pTVar12;
  long lVar13;
  long lVar14;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar2 = this->cap;
  if (capacity < uVar2 * 2) {
    capacity = uVar2 * 2;
  }
  if (0x7fffffffffffffff - uVar2 < uVar2) {
    capacity = 0x7fffffffffffffff;
  }
  lVar14 = (long)pos - (long)this->data_;
  pTVar11 = (pointer)detail::allocArray(capacity,0x10);
  pIVar5 = args->info;
  *(undefined8 *)((long)pTVar11 + lVar14) = *(undefined8 *)args;
  ((undefined8 *)((long)pTVar11 + lVar14))[1] = pIVar5;
  pTVar12 = this->data_;
  sVar3 = this->len;
  pTVar7 = pTVar11;
  if (pTVar12 + sVar3 == pos) {
    if (sVar3 != 0) {
      lVar13 = 0;
      do {
        puVar4 = (undefined8 *)((long)&pTVar12->kind + lVar13);
        uVar6 = puVar4[1];
        puVar1 = (undefined8 *)((long)&pTVar11->kind + lVar13);
        *puVar1 = *puVar4;
        puVar1[1] = uVar6;
        lVar13 = lVar13 + 0x10;
      } while (sVar3 * 0x10 != lVar13);
    }
  }
  else {
    for (; pTVar12 != pos; pTVar12 = pTVar12 + 1) {
      uVar8 = pTVar12->field_0x2;
      NVar9.raw = (pTVar12->numFlags).raw;
      uVar10 = pTVar12->rawLen;
      pIVar5 = pTVar12->info;
      pTVar7->kind = pTVar12->kind;
      pTVar7->field_0x2 = uVar8;
      pTVar7->numFlags = (NumericTokenFlags)NVar9.raw;
      pTVar7->rawLen = uVar10;
      pTVar7->info = pIVar5;
      pTVar7 = pTVar7 + 1;
    }
    sVar3 = this->len;
    pTVar12 = this->data_;
    if (pTVar12 + sVar3 != pos) {
      puVar4 = (undefined8 *)((long)pTVar11 + lVar14);
      do {
        pIVar5 = pos->info;
        puVar4[2] = *(undefined8 *)pos;
        puVar4[3] = pIVar5;
        pos = pos + 1;
        puVar4 = puVar4 + 2;
      } while (pos != pTVar12 + sVar3);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pTVar11;
  return (pointer)((long)pTVar11 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}